

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenMPIRToString.cpp
# Opt level: O1

string * __thiscall
OpenMPAffinityClause::toString_abi_cxx11_(string *__return_storage_ptr__,OpenMPAffinityClause *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  vector<const_char_*,_std::allocator<const_char_*>_> *pvVar2;
  pointer ppcVar3;
  long lVar4;
  long *plVar5;
  string *psVar6;
  int iVar7;
  pointer ppvVar8;
  undefined8 uVar9;
  ulong uVar10;
  ulong extraout_RDX;
  uint uVar11;
  ulong uVar12;
  string clause_string;
  allocator<char> local_81;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_80;
  string *local_78;
  long *local_70;
  ulong local_68;
  long local_60 [2];
  string local_50;
  
  paVar1 = &__return_storage_ptr__->field_2;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"affinity ","");
  local_70 = local_60;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"(","");
  if (this->modifier == OMPC_AFFINITY_MODIFIER_iterator) {
    std::__cxx11::string::append((char *)&local_70);
    std::__cxx11::string::append((char *)&local_70);
    ppvVar8 = (this->iterators_definition_class).
              super__Vector_base<std::vector<const_char_*,_std::allocator<const_char_*>_>_*,_std::allocator<std::vector<const_char_*,_std::allocator<const_char_*>_>_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    local_80 = paVar1;
    local_78 = __return_storage_ptr__;
    if ((this->iterators_definition_class).
        super__Vector_base<std::vector<const_char_*,_std::allocator<const_char_*>_>_*,_std::allocator<std::vector<const_char_*,_std::allocator<const_char_*>_>_*>_>
        ._M_impl.super__Vector_impl_data._M_finish != ppvVar8) {
      uVar11 = 1;
      uVar12 = 0;
      do {
        if ((ppvVar8[uVar12]->super__Vector_base<const_char_*,_std::allocator<const_char_*>_>).
            _M_impl.super__Vector_impl_data._M_finish ==
            (ppvVar8[uVar12]->super__Vector_base<const_char_*,_std::allocator<const_char_*>_>).
            _M_impl.super__Vector_impl_data._M_start) {
LAB_0017b3eb:
          uVar12 = 0;
          uVar10 = 0;
          goto LAB_0017b427;
        }
        std::__cxx11::string::append((char *)&local_70);
        ppvVar8 = (this->iterators_definition_class).
                  super__Vector_base<std::vector<const_char_*,_std::allocator<const_char_*>_>_*,_std::allocator<std::vector<const_char_*,_std::allocator<const_char_*>_>_*>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        uVar10 = (long)(this->iterators_definition_class).
                       super__Vector_base<std::vector<const_char_*,_std::allocator<const_char_*>_>_*,_std::allocator<std::vector<const_char_*,_std::allocator<const_char_*>_>_*>_>
                       ._M_impl.super__Vector_impl_data._M_finish - (long)ppvVar8 >> 3;
        if (uVar10 <= uVar12) goto LAB_0017b427;
        pvVar2 = ppvVar8[uVar12];
        ppcVar3 = (pvVar2->super__Vector_base<const_char_*,_std::allocator<const_char_*>_>)._M_impl.
                  super__Vector_impl_data._M_start;
        if (*(pointer *)
             ((long)&(pvVar2->super__Vector_base<const_char_*,_std::allocator<const_char_*>_>).
                     _M_impl.super__Vector_impl_data + 8) == ppcVar3) goto LAB_0017b3eb;
        if (**ppcVar3 != '\0') {
          std::__cxx11::string::append((char *)&local_70);
        }
        ppvVar8 = (this->iterators_definition_class).
                  super__Vector_base<std::vector<const_char_*,_std::allocator<const_char_*>_>_*,_std::allocator<std::vector<const_char_*,_std::allocator<const_char_*>_>_*>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        uVar10 = (long)(this->iterators_definition_class).
                       super__Vector_base<std::vector<const_char_*,_std::allocator<const_char_*>_>_*,_std::allocator<std::vector<const_char_*,_std::allocator<const_char_*>_>_*>_>
                       ._M_impl.super__Vector_impl_data._M_finish - (long)ppvVar8 >> 3;
        if (uVar10 <= uVar12) goto LAB_0017b427;
        pvVar2 = ppvVar8[uVar12];
        uVar10 = (long)*(pointer *)
                        ((long)&(pvVar2->
                                super__Vector_base<const_char_*,_std::allocator<const_char_*>_>).
                                _M_impl.super__Vector_impl_data + 8) -
                 *(long *)&(pvVar2->super__Vector_base<const_char_*,_std::allocator<const_char_*>_>)
                           ._M_impl.super__Vector_impl_data >> 3;
        if (uVar10 < 2) {
          uVar12 = 1;
          goto LAB_0017b427;
        }
        std::__cxx11::string::append((char *)&local_70);
        std::__cxx11::string::append((char *)&local_70);
        ppvVar8 = (this->iterators_definition_class).
                  super__Vector_base<std::vector<const_char_*,_std::allocator<const_char_*>_>_*,_std::allocator<std::vector<const_char_*,_std::allocator<const_char_*>_>_*>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        uVar10 = (long)(this->iterators_definition_class).
                       super__Vector_base<std::vector<const_char_*,_std::allocator<const_char_*>_>_*,_std::allocator<std::vector<const_char_*,_std::allocator<const_char_*>_>_*>_>
                       ._M_impl.super__Vector_impl_data._M_finish - (long)ppvVar8 >> 3;
        if (uVar10 <= uVar12) goto LAB_0017b427;
        pvVar2 = ppvVar8[uVar12];
        uVar10 = (long)*(pointer *)
                        ((long)&(pvVar2->
                                super__Vector_base<const_char_*,_std::allocator<const_char_*>_>).
                                _M_impl.super__Vector_impl_data + 8) -
                 *(long *)&(pvVar2->super__Vector_base<const_char_*,_std::allocator<const_char_*>_>)
                           ._M_impl.super__Vector_impl_data >> 3;
        if (uVar10 < 3) {
          uVar12 = 2;
          goto LAB_0017b427;
        }
        std::__cxx11::string::append((char *)&local_70);
        std::__cxx11::string::append((char *)&local_70);
        ppvVar8 = (this->iterators_definition_class).
                  super__Vector_base<std::vector<const_char_*,_std::allocator<const_char_*>_>_*,_std::allocator<std::vector<const_char_*,_std::allocator<const_char_*>_>_*>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        uVar10 = (long)(this->iterators_definition_class).
                       super__Vector_base<std::vector<const_char_*,_std::allocator<const_char_*>_>_*,_std::allocator<std::vector<const_char_*,_std::allocator<const_char_*>_>_*>_>
                       ._M_impl.super__Vector_impl_data._M_finish - (long)ppvVar8 >> 3;
        if (uVar10 <= uVar12) goto LAB_0017b427;
        pvVar2 = ppvVar8[uVar12];
        uVar10 = (long)*(pointer *)
                        ((long)&(pvVar2->
                                super__Vector_base<const_char_*,_std::allocator<const_char_*>_>).
                                _M_impl.super__Vector_impl_data + 8) -
                 *(long *)&(pvVar2->super__Vector_base<const_char_*,_std::allocator<const_char_*>_>)
                           ._M_impl.super__Vector_impl_data >> 3;
        if (uVar10 < 4) {
          uVar12 = 3;
          goto LAB_0017b427;
        }
        std::__cxx11::string::append((char *)&local_70);
        ppvVar8 = (this->iterators_definition_class).
                  super__Vector_base<std::vector<const_char_*,_std::allocator<const_char_*>_>_*,_std::allocator<std::vector<const_char_*,_std::allocator<const_char_*>_>_*>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        if ((ulong)((long)(this->iterators_definition_class).
                          super__Vector_base<std::vector<const_char_*,_std::allocator<const_char_*>_>_*,_std::allocator<std::vector<const_char_*,_std::allocator<const_char_*>_>_*>_>
                          ._M_impl.super__Vector_impl_data._M_finish - (long)ppvVar8 >> 3) <= uVar12
           ) {
LAB_0017b410:
          std::__throw_out_of_range_fmt
                    ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",
                     uVar12);
          uVar10 = extraout_RDX;
LAB_0017b421:
          uVar12 = 4;
LAB_0017b427:
          uVar9 = std::__throw_out_of_range_fmt
                            ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                             ,uVar12,uVar10);
          psVar6 = local_78;
          paVar1 = local_80;
          if (local_70 != local_60) {
            operator_delete(local_70,local_60[0] + 1);
          }
          plVar5 = (long *)(psVar6->_M_dataplus)._M_p;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)plVar5 != paVar1) {
            operator_delete(plVar5,paVar1->_M_allocated_capacity + 1);
          }
          _Unwind_Resume(uVar9);
        }
        pvVar2 = ppvVar8[uVar12];
        lVar4 = *(long *)&(pvVar2->super__Vector_base<const_char_*,_std::allocator<const_char_*>_>).
                          _M_impl.super__Vector_impl_data;
        if ((ulong)((long)*(pointer *)
                           ((long)&(pvVar2->
                                   super__Vector_base<const_char_*,_std::allocator<const_char_*>_>).
                                   _M_impl.super__Vector_impl_data + 8) - lVar4 >> 3) < 5) {
          uVar12 = 4;
          goto LAB_0017b410;
        }
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_50,*(char **)(lVar4 + 0x20),&local_81);
        iVar7 = std::__cxx11::string::compare((char *)&local_50);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
        }
        if (iVar7 != 0) {
          std::__cxx11::string::append((char *)&local_70);
          ppvVar8 = (this->iterators_definition_class).
                    super__Vector_base<std::vector<const_char_*,_std::allocator<const_char_*>_>_*,_std::allocator<std::vector<const_char_*,_std::allocator<const_char_*>_>_*>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          uVar10 = (long)(this->iterators_definition_class).
                         super__Vector_base<std::vector<const_char_*,_std::allocator<const_char_*>_>_*,_std::allocator<std::vector<const_char_*,_std::allocator<const_char_*>_>_*>_>
                         ._M_impl.super__Vector_impl_data._M_finish - (long)ppvVar8 >> 3;
          if (uVar10 <= uVar12) goto LAB_0017b427;
          pvVar2 = ppvVar8[uVar12];
          uVar10 = (long)*(pointer *)
                          ((long)&(pvVar2->
                                  super__Vector_base<const_char_*,_std::allocator<const_char_*>_>).
                                  _M_impl.super__Vector_impl_data + 8) -
                   *(long *)&(pvVar2->
                             super__Vector_base<const_char_*,_std::allocator<const_char_*>_>).
                             _M_impl.super__Vector_impl_data >> 3;
          if (4 < uVar10) {
            std::__cxx11::string::append((char *)&local_70);
            goto LAB_0017b2b3;
          }
          goto LAB_0017b421;
        }
LAB_0017b2b3:
        std::__cxx11::string::append((char *)&local_70);
        uVar12 = (ulong)uVar11;
        ppvVar8 = (this->iterators_definition_class).
                  super__Vector_base<std::vector<const_char_*,_std::allocator<const_char_*>_>_*,_std::allocator<std::vector<const_char_*,_std::allocator<const_char_*>_>_*>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        uVar11 = uVar11 + 1;
      } while (uVar12 < (ulong)((long)(this->iterators_definition_class).
                                      super__Vector_base<std::vector<const_char_*,_std::allocator<const_char_*>_>_*,_std::allocator<std::vector<const_char_*,_std::allocator<const_char_*>_>_*>_>
                                      ._M_impl.super__Vector_impl_data._M_finish - (long)ppvVar8 >>
                               3));
    }
    std::__cxx11::string::substr((ulong)&local_50,(ulong)&local_70);
    std::__cxx11::string::operator=((string *)&local_70,(string *)&local_50);
    __return_storage_ptr__ = local_78;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::string::append((char *)&local_70);
  }
  if (1 < local_68) {
    std::__cxx11::string::append((char *)&local_70);
  }
  OpenMPClause::expressionToString_abi_cxx11_(&local_50,&this->super_OpenMPClause);
  std::__cxx11::string::_M_append((char *)&local_70,(ulong)local_50._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::string::append((char *)&local_70);
  if (3 < local_68) {
    std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_70);
  }
  if (local_70 != local_60) {
    operator_delete(local_70,local_60[0] + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string OpenMPAffinityClause::toString() {
    std::vector<vector<const char*>* >* iterators_definition_class = this->getIteratorsDefinitionClass();
    std::string result = "affinity ";
    std::string clause_string = "(";
    OpenMPAffinityClauseModifier modifier = this->getModifier();
    switch (modifier) {
        case OMPC_AFFINITY_MODIFIER_iterator:
            clause_string += "iterator";
            clause_string += " ( ";
            for (unsigned int i = 0; i <iterators_definition_class->size(); i++){
                clause_string += iterators_definition_class->at(i)->at(0);
                if (strcmp(iterators_definition_class->at(i)->at(0), "\0") != 0) { clause_string +=" "; };
                clause_string +=iterators_definition_class->at(i)->at(1);
                clause_string +="=";
                clause_string +=iterators_definition_class->at(i)->at(2);
                clause_string +=":";
                clause_string +=iterators_definition_class->at(i)->at(3);
                if ((string)iterators_definition_class->at(i)->at(4) != "") {
                    clause_string +=":";clause_string +=iterators_definition_class->at(i)->at(4);
                }
                clause_string += ", ";
            };
            clause_string = clause_string.substr(0, clause_string.size()-2);
            clause_string += " )";
            break;
        default:
            ;
    }
    if (clause_string.size() > 1) {
        clause_string += " : ";
    };
    clause_string += this->expressionToString();
    clause_string += ") ";
    if (clause_string.size() > 3) {
        result += clause_string;
    };

    return result;
}